

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

void __thiscall Date::add_month(Date *this,uint32_t n)

{
  int year;
  Month MVar1;
  int *piVar2;
  double dVar3;
  int *months;
  uint32_t months_to_add;
  int years_to_add;
  uint32_t n_local;
  Date *this_local;
  
  dVar3 = floor((double)n / 12.0);
  months._4_4_ = n % 0xc;
  if (0 < (int)dVar3) {
    add_year(this,(int)dVar3);
  }
  year = Date::year(this);
  piVar2 = days_in_months(year);
  for (; months._4_4_ != 0; months._4_4_ = months._4_4_ - 1) {
    MVar1 = month(this);
    this->days = (long)piVar2[(int)(MVar1 - jan)] + this->days;
  }
  return;
}

Assistant:

void Date::add_month(uint32_t n)
{
	auto years_to_add = int(std::floor(n / 12.0));
	auto months_to_add = n % 12;
	if (years_to_add > 0)
		add_year(years_to_add);
	auto months = days_in_months(year());
	while (months_to_add > 0)
	{
		days += months[int(month()) - 1];
		--months_to_add;
	}
}